

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

TextureParameters * __thiscall
glcts::TextureBufferActiveUniformValidation::getParamsForType
          (TextureBufferActiveUniformValidation *this,GLenum uniformType)

{
  pointer pTVar1;
  uint uVar2;
  ulong uVar3;
  
  pTVar1 = (this->m_texture_params).
           super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)(((long)(this->m_texture_params).
                       super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x30) <= uVar3)
    {
      return (TextureParameters *)0x0;
    }
    uVar2 = uVar2 + 1;
  } while (pTVar1[uVar3].m_texture_uniform_type != uniformType);
  return pTVar1 + uVar3;
}

Assistant:

const TextureParameters* TextureBufferActiveUniformValidation::getParamsForType(glw::GLenum uniformType) const
{
	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		if (m_texture_params[i].get_texture_uniform_type() == uniformType)
		{
			return &m_texture_params[i];
		}
	}
	return DE_NULL;
}